

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# animation.cpp
# Opt level: O3

int main(void)

{
  pointer pbVar1;
  Pointf to;
  Pointf to_00;
  undefined1 auVar2 [16];
  TerminalInfo term_00;
  Pointf from;
  Pointf from_00;
  size_t sVar3;
  uint uVar4;
  int iVar5;
  ostream *poVar6;
  int *piVar7;
  long lVar8;
  margin_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_> *pmVar9;
  value_type *pvVar10;
  BrailleCanvas *this;
  byte bVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  Size char_sz;
  const_iterator __begin2;
  TerminalInfo term;
  RealCanvas<plot::BrailleCanvas> canvas;
  float local_350;
  value_type local_2d0;
  Margin<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_> local_260;
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  TerminalInfo local_150;
  RealCanvas<plot::BrailleCanvas> local_128;
  margin_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_> local_a8;
  
  bVar11 = 0;
  signal(2,main::anon_class_1_0_00000001::__invoke);
  local_150.mode = None;
  local_150.foreground_color.r = 0.9;
  local_150.foreground_color.g = 0.9;
  local_150.foreground_color.b = 0.9;
  local_150.foreground_color.a = 1.0;
  local_150.background_color.r = 0.0;
  local_150.background_color.g = 0.0;
  local_150.background_color.b = 0.0;
  local_150.background_color.a = 1.0;
  local_150.term_ = 1;
  plot::TerminalInfo::detect<void>(&local_150);
  local_128.bounds_.p1.x = 0.0;
  local_128.bounds_.p1.y = 1.0;
  local_128.bounds_.p2.x = 1.0;
  local_128.bounds_.p2.y = -1.0;
  term_00.term_ = local_150.term_;
  term_00.background_color.a = local_150.background_color.a;
  term_00.foreground_color.r = local_150.foreground_color.r;
  term_00.mode = local_150.mode;
  term_00.foreground_color.b = local_150.foreground_color.b;
  term_00.foreground_color.g = local_150.foreground_color.g;
  term_00.background_color.r = local_150.background_color.r;
  term_00.foreground_color.a = local_150.foreground_color.a;
  term_00.background_color.b = local_150.background_color.b;
  term_00.background_color.g = local_150.background_color.g;
  char_sz.y = 7;
  char_sz.x = 0x1e;
  plot::BrailleCanvas::BrailleCanvas(&local_128.canvas_,char_sz,term_00);
  local_260.block_.term_.term_ = local_150.term_;
  local_260.block_.term_.background_color.a = local_150.background_color.a;
  local_260.block_.term_.foreground_color.r = local_150.foreground_color.r;
  local_260.block_.term_.mode = local_150.mode;
  local_260.block_.term_.foreground_color.b = local_150.foreground_color.b;
  local_260.block_.term_.foreground_color.g = local_150.foreground_color.g;
  local_260.block_.term_.background_color.r = local_150.background_color.r;
  local_260.block_.term_.foreground_color.a = local_150.foreground_color.a;
  local_260.block_.term_.background_color.b = local_150.background_color.b;
  local_260.block_.term_.background_color.g = local_150.background_color.g;
  local_260.block_.label_._M_len = 0;
  local_260.block_.label_._M_str = (char *)0x0;
  local_260.block_.align_ = Left;
  local_260.block_.border_.top_left._M_len = 3;
  local_260.block_.border_.top_left._M_str = anon_var_dwarf_97b7;
  local_260.block_.border_.top._M_len = 3;
  local_260.block_.border_.top._M_str = anon_var_dwarf_96e2;
  local_260.block_.border_.top_right._M_len = 3;
  local_260.block_.border_.top_right._M_str = anon_var_dwarf_97cc;
  local_260.block_.border_.left._M_len = 3;
  local_260.block_.border_.left._M_str = anon_var_dwarf_96ee;
  local_260.block_.border_.right._M_len = 3;
  local_260.block_.border_.right._M_str = anon_var_dwarf_96ee;
  local_260.block_.border_.bottom_left._M_len = 3;
  local_260.block_.border_.bottom_left._M_str = anon_var_dwarf_97e1;
  local_260.block_.border_.bottom._M_len = 3;
  local_260.block_.border_.bottom._M_str = anon_var_dwarf_96e2;
  local_260.block_.border_.bottom_right._M_len = 3;
  local_260.block_.border_.bottom_right._M_str = anon_var_dwarf_97f6;
  local_260.block_.block_ = &local_128;
  local_260.top_ = 1;
  local_260.right_ = 2;
  local_260.bottom_ = 1;
  local_260.left_ = 2;
  fVar12 = local_128.bounds_.p1.x;
  fVar19 = local_128.bounds_.p2.x - fVar12;
  fVar20 = local_128.bounds_.p2.y - local_128.bounds_.p1.y;
  auVar2._4_4_ = -(uint)(fVar19 < 0.0);
  auVar2._0_4_ = -(uint)(fVar19 < 0.0);
  auVar2._8_4_ = -(uint)(fVar20 < 0.0);
  auVar2._12_4_ = -(uint)(fVar20 < 0.0);
  uVar4 = movmskpd((int)local_260.block_.block_,auVar2);
  if ((uVar4 & 1) != 0) {
    fVar19 = -fVar19;
  }
  if ((uVar4 & 2) != 0) {
    fVar20 = -fVar20;
  }
  fVar20 = fVar20 * 0.5;
  fVar19 = fVar19 * (1.0 / (float)(long)(local_128.canvas_.cols_ * 2 + -1));
  fVar13 = local_128.bounds_.p2.x + fVar19;
  local_178._8_4_ = local_128.bounds_.p1.y;
  local_178._0_8_ = (ulong)local_128.bounds_.p1 & 0xffffffff;
  local_178._12_4_ = 0;
  local_168._8_4_ = local_128.bounds_.p2.y;
  local_168._0_8_ = (ulong)local_128.bounds_.p2 & 0xffffffff;
  local_168._12_4_ = 0;
  local_350 = 0.0;
  do {
    this = &local_128.canvas_;
    local_a8.margin_ = (Margin<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_> *)0x0;
    local_a8.overflow_ = 0;
    local_a8.line_.line_.frame_._0_4_ = 0;
    std::vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>::
    _M_fill_assign(&local_128.canvas_.blocks_.
                    super_vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
                   ,((long)local_128.canvas_.blocks_.
                           super_vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
                           .
                           super__Vector_base<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_128.canvas_.blocks_.
                           super_vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
                           .
                           super__Vector_base<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x3333333333333333,
                   (value_type *)&local_a8);
    plot::BrailleCanvas::push(this);
    fVar14 = (fVar12 + local_350) * 12.566368;
    fVar15 = sinf(fVar14);
    if ((fVar19 != 0.0) || (NAN(fVar19))) {
      fVar15 = fVar15 * fVar20;
      fVar18 = fVar12;
      do {
        fVar17 = fVar18 + fVar19;
        if (fVar19 <= 0.0) {
          if (fVar17 <= fVar13) break;
        }
        else if (fVar13 <= fVar17) break;
        fVar16 = sinf((local_350 + fVar17) * 12.566368);
        from.y = fVar15;
        from.x = fVar18;
        to.y = fVar16 * fVar20;
        to.x = fVar17;
        plot::RealCanvas<plot::BrailleCanvas>::line<>
                  (&local_128,(Color *)plot::palette::royalblue,from,to);
        fVar15 = fVar16 * fVar20;
        fVar18 = fVar17;
      } while( true );
    }
    plot::BrailleCanvas::pop(this,Over);
    plot::BrailleCanvas::push(this);
    fVar14 = cosf(fVar14);
    if ((fVar19 != 0.0) || (NAN(fVar19))) {
      fVar14 = fVar14 * fVar20;
      fVar15 = fVar12;
      do {
        fVar18 = fVar15 + fVar19;
        if (fVar19 <= 0.0) {
          if (fVar18 <= fVar13) break;
        }
        else if (fVar13 <= fVar18) break;
        fVar17 = cosf((local_350 + fVar18) * 12.566368);
        from_00.y = fVar14;
        from_00.x = fVar15;
        to_00.y = fVar17 * fVar20;
        to_00.x = fVar18;
        plot::RealCanvas<plot::BrailleCanvas>::line<>
                  (&local_128,(Color *)plot::palette::red,from_00,to_00);
        fVar14 = fVar17 * fVar20;
        fVar15 = fVar18;
      } while( true );
    }
    plot::BrailleCanvas::pop(this,Over);
    local_a8.margin_ =
         (Margin<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_> *)
         CONCAT44(local_a8.margin_._4_4_,2);
    plot::RealCanvas<plot::BrailleCanvas>::line<plot::TerminalOp>
              (&local_128,&local_150.foreground_color,(Pointf)local_178._0_8_,
               (Pointf)local_168._0_8_,(TerminalOp *)&local_a8);
    sVar3 = local_260.bottom_;
    local_2d0.overflow_ = -local_260.top_;
    local_2d0.line_.line_.line_.line_.canvas_ = &(local_260.block_.block_)->canvas_;
    local_2d0.line_.line_.line_.line_.it_._M_current =
         ((local_260.block_.block_)->canvas_).blocks_.
         super_vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
         .
         super__Vector_base<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_2d0.line_.line_.end_.line_.it_._M_current =
         ((local_260.block_.block_)->canvas_).blocks_.
         super_vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
         .
         super__Vector_base<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_2d0.margin_ = &local_260;
    local_2d0.line_.line_.frame_ = &local_260.block_;
    local_2d0.line_.line_.overflow_ = -1;
    local_2d0.end_.line_.overflow_ = 1;
    pbVar1 = ((local_260.block_.block_)->canvas_).blocks_.
             super_vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
             .
             super__Vector_base<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_2d0.line_.line_.end_.line_.canvas_ = local_2d0.line_.line_.line_.line_.canvas_;
    local_2d0.end_.line_.frame_ = local_2d0.line_.line_.frame_;
    local_2d0.end_.line_.line_.line_.canvas_ = local_2d0.line_.line_.line_.line_.canvas_;
    local_2d0.end_.line_.line_.line_.it_._M_current =
         local_2d0.line_.line_.end_.line_.it_._M_current;
    local_2d0.end_.line_.end_.line_.canvas_ = local_2d0.line_.line_.line_.line_.canvas_;
    local_2d0.end_.line_.end_.line_.it_._M_current = local_2d0.line_.line_.end_.line_.it_._M_current
    ;
    do {
      if ((local_150.mode != None) && (local_150.mode != Windows)) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\x1b[K",3);
      }
      poVar6 = plot::detail::operator<<((ostream *)&std::cout,&local_2d0);
      local_a8.margin_ =
           (Margin<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_> *)
           CONCAT71(local_a8.margin_._1_7_,10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)&local_a8,1);
      plot::detail::margin_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>::next
                (&local_a8,&local_2d0);
      pmVar9 = &local_a8;
      pvVar10 = &local_2d0;
      for (lVar8 = 0xe; lVar8 != 0; lVar8 = lVar8 + -1) {
        pvVar10->margin_ = pmVar9->margin_;
        pmVar9 = (margin_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_> *)
                 ((long)pmVar9 + (ulong)bVar11 * -0x10 + 8);
        pvVar10 = (value_type *)((long)pvVar10 + (ulong)bVar11 * -0x10 + 8);
      }
    } while (((local_2d0.line_.line_.line_.line_.it_._M_current != pbVar1) ||
             (local_2d0.line_.line_.overflow_ != 1)) || (local_2d0.overflow_ != sVar3));
    std::ostream::flush();
    if (run == 0) {
LAB_00106b01:
      std::
      _Fwd_list_base<plot::detail::braille::image_t,_std::allocator<plot::detail::braille::image_t>_>
      ::~_Fwd_list_base(&local_128.canvas_.available_layers_.
                         super__Fwd_list_base<plot::detail::braille::image_t,_std::allocator<plot::detail::braille::image_t>_>
                       );
      std::
      _Fwd_list_base<plot::detail::braille::image_t,_std::allocator<plot::detail::braille::image_t>_>
      ::~_Fwd_list_base(&local_128.canvas_.stack_.
                         super__Fwd_list_base<plot::detail::braille::image_t,_std::allocator<plot::detail::braille::image_t>_>
                       );
      if (local_128.canvas_.blocks_.
          super_vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
          .
          super__Vector_base<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_128.canvas_.blocks_.
                        super_vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
                        .
                        super__Vector_base<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_128.canvas_.blocks_.
                              super_vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
                              .
                              super__Vector_base<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_128.canvas_.blocks_.
                              super_vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
                              .
                              super__Vector_base<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      return 0;
    }
    local_a8.margin_ = (Margin<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_> *)0x0;
    local_a8.overflow_ = 40000000;
    do {
      iVar5 = nanosleep((timespec *)&local_a8,(timespec *)&local_a8);
      if (iVar5 != -1) break;
      piVar7 = __errno_location();
    } while (*piVar7 == 4);
    if (run == 0) goto LAB_00106b01;
    local_350 = local_350 + 0.01;
    if (1.0 <= local_350) {
      fVar14 = truncf(local_350);
      local_350 = local_350 - fVar14;
    }
    local_a8.margin_ =
         (Margin<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_> *)(ulong)local_150.mode;
    local_a8.overflow_ =
         CONCAT44(local_a8.overflow_._4_4_,
                  (int)((local_260.block_.block_)->canvas_).lines_ + (int)local_260.top_ +
                  (int)local_260.bottom_ + 2);
    plot::detail::operator<<
              ((ostream *)&std::cout,
               (ansi_manip_wrapper<plot::ansi::detail::cursor_move> *)&local_a8);
    std::ostream::flush();
  } while( true );
}

Assistant:

int main() {
    std::signal(SIGINT, [](int) {
        run = false;
    });

    TerminalInfo term;
    term.detect();

    RealCanvas<BrailleCanvas> canvas({ { 0.0f, 1.0f }, { 1.0f, -1.0f } }, Size(30, 7), term);
    auto layout = margin(frame(&canvas, term));

    auto bounds = canvas.bounds();
    auto size = canvas.size();
    auto pixel = canvas.unmap_size({ 1, 1 });

    float A = size.y/2.0f;
    float f = 2.0f;

    auto sin = [A,f](float t) {
        return A*std::sin(2*3.141592f*f*t);
    };

    auto cos = [A,f](float t) {
        return A*std::cos(2*3.141592f*f*t);
    };

    auto plot_fn = [](auto const& fn, float t_) {
        return [&fn, t_](float x) -> Pointf {
            return { x, fn(t_ + x) };
        };
    };

    // Plot function in range [bounds.p1.x, bounds.p2.x] with step of 1px
    // Actually, the range is [bounds.p1.x, bounds.p2.x + 1px)
    range_iterator<float> rng(bounds.p1.x, bounds.p2.x + pixel.x, pixel.x);
    range_iterator<float> rng_end;

    float t = 0.0f;

    while (true) {
        canvas.clear()
              .path(palette::royalblue, map(rng, plot_fn(sin, t)), map(rng_end, plot_fn(sin, t)))
              .path(palette::red, map(rng, plot_fn(cos, t)), map(rng_end, plot_fn(cos, t)))
              .line(term.foreground_color, { bounds.p1.x, 0.0f }, { bounds.p2.x, 0.0f }, TerminalOp::ClipSrc);

        for (auto const& line: layout)
            std::cout << term.clear_line() << line << '\n';

        std::cout << std::flush;

        if (!run)
            break;

        using namespace std::chrono_literals;
        std::this_thread::sleep_for(40ms);

        if (!run)
            break;

        t += 0.01f;
        if (t >= 1.0f)
            t -= std::trunc(t);

        std::cout << term.move_up(layout.size().y) << std::flush;
    }

    return 0;
}